

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DecorationManager::AreDecorationsTheSame
          (DecorationManager *this,Instruction *inst1,Instruction *inst2,bool ignore_target)

{
  Op OVar1;
  bool bVar2;
  uint uVar3;
  Operand *pOVar4;
  Operand *pOVar5;
  uint uVar6;
  uint32_t index;
  
  OVar1 = inst1->opcode_;
  if ((((OVar1 - OpDecorate < 2) || (OVar1 == OpDecorateString)) || (OVar1 == OpDecorateId)) &&
     (OVar1 == inst2->opcode_)) {
    uVar3 = (inst1->has_result_id_ & 1) + 1;
    if (inst1->has_type_id_ == false) {
      uVar3 = (uint)inst1->has_result_id_;
    }
    uVar3 = (int)((ulong)((long)(inst1->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst1->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar3;
    uVar6 = (inst2->has_result_id_ & 1) + 1;
    if (inst2->has_type_id_ == false) {
      uVar6 = (uint)inst2->has_result_id_;
    }
    if (uVar3 == (int)((ulong)((long)(inst2->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst2->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                 uVar6) {
      index = (uint32_t)ignore_target;
      if (uVar3 <= ignore_target) {
        return true;
      }
      while( true ) {
        pOVar4 = Instruction::GetInOperand(inst1,index);
        pOVar5 = Instruction::GetInOperand(inst2,index);
        if ((pOVar4->type != pOVar5->type) ||
           (bVar2 = utils::operator==(&pOVar4->words,&pOVar5->words), !bVar2)) break;
        index = index + 1;
        uVar3 = (inst1->has_result_id_ & 1) + 1;
        if (inst1->has_type_id_ == false) {
          uVar3 = (uint)inst1->has_result_id_;
        }
        if ((int)((ulong)((long)(inst1->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst1->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar3 <= index) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool DecorationManager::AreDecorationsTheSame(const Instruction* inst1,
                                              const Instruction* inst2,
                                              bool ignore_target) const {
  switch (inst1->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
      break;
    default:
      return false;
  }

  if (inst1->opcode() != inst2->opcode() ||
      inst1->NumInOperands() != inst2->NumInOperands())
    return false;

  for (uint32_t i = ignore_target ? 1u : 0u; i < inst1->NumInOperands(); ++i)
    if (inst1->GetInOperand(i) != inst2->GetInOperand(i)) return false;

  return true;
}